

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmLocalGenerator.cxx
# Opt level: O3

void __thiscall cmLocalGenerator::GenerateInstallRules(cmLocalGenerator *this)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  cmMakefile *pcVar2;
  pointer pcVar3;
  pointer ppcVar4;
  cmInstallGenerator *this_00;
  pointer pbVar5;
  cmLocalGenerator *pcVar6;
  int iVar7;
  PolicyStatus PVar8;
  char *pcVar9;
  long lVar10;
  string *psVar11;
  undefined8 extraout_RAX;
  ostream *poVar12;
  long *plVar13;
  size_t sVar14;
  PolicyID id;
  pointer this_01;
  string *configurationType;
  pointer s;
  const_iterator __begin2;
  undefined *puVar15;
  pointer ppcVar16;
  const_iterator __end2;
  char *__s;
  bool bVar17;
  bool haveInstallAfterSubdirectory;
  bool haveSubdirectoryInstall;
  string odir;
  string default_config;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  configurationTypes;
  string homedir;
  vector<cmStateSnapshot,_std::allocator<cmStateSnapshot>_> children;
  string file;
  ostringstream e;
  cmGeneratedFileStream fout;
  char local_4d6 [2];
  undefined4 local_4d4;
  string local_4d0;
  char *local_4b0;
  long *local_4a8;
  long local_4a0;
  long local_498 [2];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_488;
  long *local_470;
  size_t local_468;
  long local_460 [2];
  cmLocalGenerator *local_450;
  vector<cmStateSnapshot,_std::allocator<cmStateSnapshot>_> local_448;
  string local_430;
  string local_410;
  undefined1 local_3f0 [16];
  cmLinkedTree<cmStateDetail::BuildsystemDirectoryStateType> local_3e0 [2];
  ios_base local_380 [264];
  undefined1 local_278 [584];
  
  pcVar2 = this->Makefile;
  local_278._0_8_ = local_278 + 0x10;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_278,"CMAKE_INSTALL_PREFIX","");
  pcVar9 = cmMakefile::GetDefinition(pcVar2,(string *)local_278);
  if ((undefined1 *)local_278._0_8_ != local_278 + 0x10) {
    operator_delete((void *)local_278._0_8_,local_278._16_8_ + 1);
  }
  __s = "/usr/local";
  if (pcVar9 != (char *)0x0) {
    __s = pcVar9;
  }
  pcVar2 = this->Makefile;
  local_278._0_8_ = local_278 + 0x10;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_278,"CMAKE_STAGING_PREFIX","");
  pcVar9 = cmMakefile::GetDefinition(pcVar2,(string *)local_278);
  if ((undefined1 *)local_278._0_8_ != local_278 + 0x10) {
    operator_delete((void *)local_278._0_8_,local_278._16_8_ + 1);
  }
  if (pcVar9 != (char *)0x0) {
    __s = pcVar9;
  }
  local_488.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (string *)0x0;
  local_488.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (string *)0x0;
  local_488.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  cmMakefile::GetConfigurations(&local_410,this->Makefile,&local_488,false);
  local_4a8 = local_498;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_4a8,local_410._M_dataplus._M_p,
             local_410._M_dataplus._M_p + local_410._M_string_length);
  local_450 = this;
  if (local_4a0 == 0) {
    puVar15 = &DAT_0066ccb0;
    lVar10 = 0;
    local_4b0 = __s;
    do {
      pbVar5 = local_488.
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_finish;
      s = local_488.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_start;
      if (local_488.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_start ==
          local_488.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_finish) {
        bVar17 = true;
      }
      else {
        do {
          cmsys::SystemTools::UpperCase((string *)local_278,s);
          iVar7 = std::__cxx11::string::compare((char *)local_278);
          if ((undefined1 *)local_278._0_8_ != local_278 + 0x10) {
            operator_delete((void *)local_278._0_8_,local_278._16_8_ + 1);
          }
          if (iVar7 == 0) {
            std::__cxx11::string::_M_assign((string *)&local_4a8);
          }
          s = s + 1;
        } while (s != pbVar5);
        bVar17 = local_4a0 == 0;
        lVar10 = local_4a0;
      }
      this = local_450;
      __s = local_4b0;
    } while ((*(long *)(puVar15 + 8) != 0) && (puVar15 = puVar15 + 8, bVar17));
    if ((lVar10 == 0) &&
       (local_488.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start !=
        local_488.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish)) {
      std::__cxx11::string::_M_assign((string *)&local_4a8);
    }
  }
  cmStateSnapshot::GetDirectory((cmStateDirectory *)local_278,&this->StateSnapshot);
  psVar11 = cmStateDirectory::GetCurrentBinary_abi_cxx11_((cmStateDirectory *)local_278);
  local_430._M_dataplus._M_p = (pointer)&local_430.field_2;
  pcVar3 = (psVar11->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_430,pcVar3,pcVar3 + psVar11->_M_string_length);
  psVar11 = cmState::GetBinaryDirectory_abi_cxx11_
                      ((this->GlobalGenerator->CMakeInstance->State)._M_t.
                       super___uniq_ptr_impl<cmState,_std::default_delete<cmState>_>._M_t.
                       super__Tuple_impl<0UL,_cmState_*,_std::default_delete<cmState>_>.
                       super__Head_base<0UL,_cmState_*,_false>._M_head_impl);
  local_470 = local_460;
  pcVar3 = (psVar11->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_470,pcVar3,pcVar3 + psVar11->_M_string_length);
  if (local_430._M_string_length == local_468) {
    if (local_430._M_string_length == 0) {
      local_4d4 = (undefined4)CONCAT71((int7)((ulong)extraout_RAX >> 8),1);
    }
    else {
      iVar7 = bcmp(local_430._M_dataplus._M_p,local_470,local_430._M_string_length);
      local_4d4 = CONCAT31((int3)((uint)iVar7 >> 8),iVar7 == 0);
    }
  }
  else {
    local_4d4 = 0;
  }
  std::__cxx11::string::append((char *)&local_430);
  cmGeneratedFileStream::cmGeneratedFileStream
            ((cmGeneratedFileStream *)local_278,&local_430,false,None);
  cmGeneratedFileStream::SetCopyIfDifferent((cmGeneratedFileStream *)local_278,true);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_278,"# Install script for directory: ",0x20);
  cmStateSnapshot::GetDirectory((cmStateDirectory *)local_3f0,&this->StateSnapshot);
  psVar11 = cmStateDirectory::GetCurrentSource_abi_cxx11_((cmStateDirectory *)local_3f0);
  poVar12 = std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)local_278,(psVar11->_M_dataplus)._M_p,psVar11->_M_string_length);
  std::ios::widen((char)poVar12->_vptr_basic_ostream[-3] + (char)poVar12);
  std::ostream::put((char)poVar12);
  plVar13 = (long *)std::ostream::flush();
  std::ios::widen((char)*(undefined8 *)(*plVar13 + -0x18) + (char)plVar13);
  std::ostream::put((char)plVar13);
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_278,"# Set the install prefix",0x18);
  std::ios::widen((char)(ostream *)local_278 + (char)*(undefined8 *)(local_278._0_8_ + -0x18));
  std::ostream::put((char)local_278);
  poVar12 = (ostream *)std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar12,"if(NOT DEFINED CMAKE_INSTALL_PREFIX)",0x24);
  std::ios::widen((char)poVar12->_vptr_basic_ostream[-3] + (char)poVar12);
  std::ostream::put((char)poVar12);
  poVar12 = (ostream *)std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>(poVar12,"  set(CMAKE_INSTALL_PREFIX \"",0x1c);
  sVar14 = strlen(__s);
  std::__ostream_insert<char,std::char_traits<char>>(poVar12,__s,sVar14);
  std::__ostream_insert<char,std::char_traits<char>>(poVar12,"\")",2);
  std::ios::widen((char)poVar12->_vptr_basic_ostream[-3] + (char)poVar12);
  std::ostream::put((char)poVar12);
  poVar12 = (ostream *)std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>(poVar12,"endif()",7);
  std::ios::widen((char)poVar12->_vptr_basic_ostream[-3] + (char)poVar12);
  std::ostream::put((char)poVar12);
  poVar12 = (ostream *)std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar12,"string(REGEX REPLACE \"/$\" \"\" CMAKE_INSTALL_PREFIX ",0x32);
  std::__ostream_insert<char,std::char_traits<char>>(poVar12,"\"${CMAKE_INSTALL_PREFIX}\")",0x1a);
  std::ios::widen((char)poVar12->_vptr_basic_ostream[-3] + (char)poVar12);
  std::ostream::put((char)poVar12);
  plVar13 = (long *)std::ostream::flush();
  std::ios::widen((char)*(undefined8 *)(*plVar13 + -0x18) + (char)plVar13);
  std::ostream::put((char)plVar13);
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_278,
             "# Set the install configuration name.\nif(NOT DEFINED CMAKE_INSTALL_CONFIG_NAME)\n  if(BUILD_TYPE)\n    string(REGEX REPLACE \"^[^A-Za-z0-9_]+\" \"\"\n           CMAKE_INSTALL_CONFIG_NAME \"${BUILD_TYPE}\")\n  else()\n    set(CMAKE_INSTALL_CONFIG_NAME \""
             ,0xf1);
  poVar12 = std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)local_278,(char *)local_4a8,local_4a0);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar12,
             "\")\n  endif()\n  message(STATUS \"Install configuration: \\\"${CMAKE_INSTALL_CONFIG_NAME}\\\"\")\nendif()\n\n"
             ,0x62);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_278,
             "# Set the component getting installed.\nif(NOT CMAKE_INSTALL_COMPONENT)\n  if(COMPONENT)\n    message(STATUS \"Install component: \\\"${COMPONENT}\\\"\")\n    set(CMAKE_INSTALL_COMPONENT \"${COMPONENT}\")\n  else()\n    set(CMAKE_INSTALL_COMPONENT)\n  endif()\nendif()\n\n"
             ,0xfe);
  pcVar2 = this->Makefile;
  local_3f0._0_8_ = local_3e0;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_3f0,"CMAKE_INSTALL_SO_NO_EXE","");
  pcVar9 = cmMakefile::GetDefinition(pcVar2,(string *)local_3f0);
  if ((cmLinkedTree<cmStateDetail::BuildsystemDirectoryStateType> *)local_3f0._0_8_ != local_3e0) {
    operator_delete((void *)local_3f0._0_8_,
                    (ulong)((long)local_3e0[0].Data.
                                  super__Vector_base<cmStateDetail::BuildsystemDirectoryStateType,_std::allocator<cmStateDetail::BuildsystemDirectoryStateType>_>
                                  ._M_impl.super__Vector_impl_data._M_start + 1));
  }
  if (pcVar9 != (char *)0x0) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_278,
               "# Install shared libraries without execute permission?\nif(NOT DEFINED CMAKE_INSTALL_SO_NO_EXE)\n  set(CMAKE_INSTALL_SO_NO_EXE \""
               ,0x7e);
    sVar14 = strlen(pcVar9);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_278,pcVar9,sVar14);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_278,"\")\nendif()\n\n",0xc);
  }
  pcVar2 = this->Makefile;
  local_3f0._0_8_ = local_3e0;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_3f0,"CMAKE_CROSSCOMPILING","");
  pcVar9 = cmMakefile::GetDefinition(pcVar2,(string *)local_3f0);
  if ((cmLinkedTree<cmStateDetail::BuildsystemDirectoryStateType> *)local_3f0._0_8_ != local_3e0) {
    operator_delete((void *)local_3f0._0_8_,
                    (ulong)((long)local_3e0[0].Data.
                                  super__Vector_base<cmStateDetail::BuildsystemDirectoryStateType,_std::allocator<cmStateDetail::BuildsystemDirectoryStateType>_>
                                  ._M_impl.super__Vector_impl_data._M_start + 1));
  }
  if (pcVar9 != (char *)0x0) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_278,
               "# Is this installation the result of a crosscompile?\nif(NOT DEFINED CMAKE_CROSSCOMPILING)\n  set(CMAKE_CROSSCOMPILING \""
               ,0x76);
    sVar14 = strlen(pcVar9);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_278,pcVar9,sVar14);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_278,"\")\nendif()\n\n",0xc);
  }
  pcVar2 = this->Makefile;
  local_3f0._0_8_ = local_3e0;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_3f0,"CMAKE_INSTALL_DEFAULT_DIRECTORY_PERMISSIONS","");
  pcVar9 = cmMakefile::GetDefinition(pcVar2,(string *)local_3f0);
  if ((cmLinkedTree<cmStateDetail::BuildsystemDirectoryStateType> *)local_3f0._0_8_ != local_3e0) {
    operator_delete((void *)local_3f0._0_8_,
                    (ulong)((long)local_3e0[0].Data.
                                  super__Vector_base<cmStateDetail::BuildsystemDirectoryStateType,_std::allocator<cmStateDetail::BuildsystemDirectoryStateType>_>
                                  ._M_impl.super__Vector_impl_data._M_start + 1));
  }
  if (pcVar9 != (char *)0x0) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_278,
               "# Set default install directory permissions.\nif(NOT DEFINED CMAKE_INSTALL_DEFAULT_DIRECTORY_PERMISSIONS)\n  set(CMAKE_INSTALL_DEFAULT_DIRECTORY_PERMISSIONS \""
               ,0x9c);
    sVar14 = strlen(pcVar9);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_278,pcVar9,sVar14);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_278,"\")\nendif()\n\n",0xc);
  }
  PVar8 = cmMakefile::GetPolicyStatus(this->Makefile,CMP0082,false);
  local_4d6[1] = 0;
  local_4d6[0] = '\0';
  ppcVar16 = (this->Makefile->InstallGenerators).
             super__Vector_base<cmInstallGenerator_*,_std::allocator<cmInstallGenerator_*>_>._M_impl
             .super__Vector_impl_data._M_start;
  ppcVar4 = (this->Makefile->InstallGenerators).
            super__Vector_base<cmInstallGenerator_*,_std::allocator<cmInstallGenerator_*>_>._M_impl.
            super__Vector_impl_data._M_finish;
  local_4b0 = (char *)CONCAT44(local_4b0._4_4_,PVar8);
  if (PVar8 == WARN) {
    if (ppcVar16 != ppcVar4) {
      do {
        this_00 = *ppcVar16;
        (*(this_00->super_cmScriptGenerator)._vptr_cmScriptGenerator[9])
                  (this_00,local_4d6 + 1,local_4d6);
        cmScriptGenerator::Generate
                  (&this_00->super_cmScriptGenerator,(ostream *)local_278,&local_410,&local_488);
        ppcVar16 = ppcVar16 + 1;
      } while (ppcVar16 != ppcVar4);
    }
  }
  else if (ppcVar16 != ppcVar4) {
    do {
      cmScriptGenerator::Generate
                (&(*ppcVar16)->super_cmScriptGenerator,(ostream *)local_278,&local_410,&local_488);
      ppcVar16 = ppcVar16 + 1;
    } while (ppcVar16 != ppcVar4);
  }
  pcVar6 = local_450;
  GenerateTargetInstallRules(local_450,(ostream *)local_278,&local_410,&local_488);
  if ((int)local_4b0 != 0) {
    if ((int)local_4b0 != 1) goto LAB_0016469d;
    if (local_4d6[0] == '\x01') {
      pcVar2 = pcVar6->Makefile;
      local_3f0._0_8_ = local_3e0;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_3f0,"CMAKE_POLICY_WARNING_CMP0082","");
      bVar17 = cmMakefile::PolicyOptionalWarningEnabled(pcVar2,(string *)local_3f0);
      if ((cmLinkedTree<cmStateDetail::BuildsystemDirectoryStateType> *)local_3f0._0_8_ != local_3e0
         ) {
        operator_delete((void *)local_3f0._0_8_,
                        (ulong)((long)local_3e0[0].Data.
                                      super__Vector_base<cmStateDetail::BuildsystemDirectoryStateType,_std::allocator<cmStateDetail::BuildsystemDirectoryStateType>_>
                                      ._M_impl.super__Vector_impl_data._M_start + 1));
      }
      if (bVar17) {
        std::__cxx11::ostringstream::ostringstream((ostringstream *)local_3f0);
        cmPolicies::GetPolicyWarning_abi_cxx11_(&local_4d0,(cmPolicies *)0x52,id);
        poVar12 = std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)local_3f0,local_4d0._M_dataplus._M_p,
                             local_4d0._M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>(poVar12,"\n",1);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_4d0._M_dataplus._M_p != &local_4d0.field_2) {
          operator_delete(local_4d0._M_dataplus._M_p,local_4d0.field_2._M_allocated_capacity + 1);
        }
        std::__cxx11::stringbuf::str();
        cmake::IssueMessage(pcVar6->GlobalGenerator->CMakeInstance,AUTHOR_WARNING,&local_4d0,
                            &pcVar6->DirectoryBacktrace);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_4d0._M_dataplus._M_p != &local_4d0.field_2) {
          operator_delete(local_4d0._M_dataplus._M_p,local_4d0.field_2._M_allocated_capacity + 1);
        }
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_3f0);
        std::ios_base::~ios_base(local_380);
      }
    }
  }
  cmMakefile::GetStateSnapshot(pcVar6->Makefile);
  cmStateSnapshot::GetChildren(&local_448,(cmStateSnapshot *)local_3f0);
  if (local_448.super__Vector_base<cmStateSnapshot,_std::allocator<cmStateSnapshot>_>._M_impl.
      super__Vector_impl_data._M_start !=
      local_448.super__Vector_base<cmStateSnapshot,_std::allocator<cmStateSnapshot>_>._M_impl.
      super__Vector_impl_data._M_finish) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_278,"if(NOT CMAKE_INSTALL_LOCAL_ONLY)\n",0x21);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_278,"  # Include the install script for each subdirectory.\n",0x36);
    if (local_448.super__Vector_base<cmStateSnapshot,_std::allocator<cmStateSnapshot>_>._M_impl.
        super__Vector_impl_data._M_start !=
        local_448.super__Vector_base<cmStateSnapshot,_std::allocator<cmStateSnapshot>_>._M_impl.
        super__Vector_impl_data._M_finish) {
      paVar1 = &local_4d0.field_2;
      this_01 = local_448.super__Vector_base<cmStateSnapshot,_std::allocator<cmStateSnapshot>_>.
                _M_impl.super__Vector_impl_data._M_start;
      do {
        cmStateSnapshot::GetDirectory((cmStateDirectory *)local_3f0,this_01);
        local_4d0._M_dataplus._M_p = (pointer)paVar1;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_4d0,"EXCLUDE_FROM_ALL","");
        bVar17 = cmStateDirectory::GetPropertyAsBool((cmStateDirectory *)local_3f0,&local_4d0);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_4d0._M_dataplus._M_p != paVar1) {
          operator_delete(local_4d0._M_dataplus._M_p,local_4d0.field_2._M_allocated_capacity + 1);
        }
        if (!bVar17) {
          cmStateSnapshot::GetDirectory((cmStateDirectory *)local_3f0,this_01);
          psVar11 = cmStateDirectory::GetCurrentBinary_abi_cxx11_((cmStateDirectory *)local_3f0);
          pcVar3 = (psVar11->_M_dataplus)._M_p;
          local_4d0._M_dataplus._M_p = (pointer)paVar1;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)&local_4d0,pcVar3,pcVar3 + psVar11->_M_string_length);
          cmsys::SystemTools::ConvertToUnixSlashes(&local_4d0);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)local_278,"  include(\"",0xb);
          poVar12 = std::__ostream_insert<char,std::char_traits<char>>
                              ((ostream *)local_278,local_4d0._M_dataplus._M_p,
                               local_4d0._M_string_length);
          std::__ostream_insert<char,std::char_traits<char>>(poVar12,"/cmake_install.cmake\")",0x16)
          ;
          std::ios::widen((char)poVar12->_vptr_basic_ostream[-3] + (char)poVar12);
          std::ostream::put((char)poVar12);
          std::ostream::flush();
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_4d0._M_dataplus._M_p != paVar1) {
            operator_delete(local_4d0._M_dataplus._M_p,local_4d0.field_2._M_allocated_capacity + 1);
          }
        }
        this_01 = this_01 + 1;
      } while (this_01 !=
               local_448.super__Vector_base<cmStateSnapshot,_std::allocator<cmStateSnapshot>_>.
               _M_impl.super__Vector_impl_data._M_finish);
    }
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_278,"\n",1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_278,"endif()\n\n",9);
  }
  if (local_448.super__Vector_base<cmStateSnapshot,_std::allocator<cmStateSnapshot>_>._M_impl.
      super__Vector_impl_data._M_start != (cmStateSnapshot *)0x0) {
    operator_delete(local_448.super__Vector_base<cmStateSnapshot,_std::allocator<cmStateSnapshot>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    (long)local_448.
                          super__Vector_base<cmStateSnapshot,_std::allocator<cmStateSnapshot>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_448.
                          super__Vector_base<cmStateSnapshot,_std::allocator<cmStateSnapshot>_>.
                          _M_impl.super__Vector_impl_data._M_start);
  }
LAB_0016469d:
  if ((char)local_4d4 != '\0') {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_278,
               "if(CMAKE_INSTALL_COMPONENT)\n  set(CMAKE_INSTALL_MANIFEST \"install_manifest_${CMAKE_INSTALL_COMPONENT}.txt\")\nelse()\n  set(CMAKE_INSTALL_MANIFEST \"install_manifest.txt\")\nendif()\n\nstring(REPLACE \";\" \"\\n\" CMAKE_INSTALL_MANIFEST_CONTENT\n       \"${CMAKE_INSTALL_MANIFEST_FILES}\")\nfile(WRITE \""
               ,0x11e);
    poVar12 = std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)local_278,(char *)local_470,local_468);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar12,"/${CMAKE_INSTALL_MANIFEST}\"\n     \"${CMAKE_INSTALL_MANIFEST_CONTENT}\")\n"
               ,0x46);
  }
  cmGeneratedFileStream::~cmGeneratedFileStream((cmGeneratedFileStream *)local_278);
  if (local_470 != local_460) {
    operator_delete(local_470,local_460[0] + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_430._M_dataplus._M_p != &local_430.field_2) {
    operator_delete(local_430._M_dataplus._M_p,local_430.field_2._M_allocated_capacity + 1);
  }
  if (local_4a8 != local_498) {
    operator_delete(local_4a8,local_498[0] + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_410._M_dataplus._M_p != &local_410.field_2) {
    operator_delete(local_410._M_dataplus._M_p,local_410.field_2._M_allocated_capacity + 1);
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_488);
  return;
}

Assistant:

void cmLocalGenerator::GenerateInstallRules()
{
  // Compute the install prefix.
  const char* prefix = this->Makefile->GetDefinition("CMAKE_INSTALL_PREFIX");

#if defined(_WIN32) && !defined(__CYGWIN__)
  std::string prefix_win32;
  if (!prefix) {
    if (!cmSystemTools::GetEnv("SystemDrive", prefix_win32)) {
      prefix_win32 = "C:";
    }
    const char* project_name = this->Makefile->GetDefinition("PROJECT_NAME");
    if (project_name && project_name[0]) {
      prefix_win32 += "/Program Files/";
      prefix_win32 += project_name;
    } else {
      prefix_win32 += "/InstalledCMakeProject";
    }
    prefix = prefix_win32.c_str();
  }
#elif defined(__HAIKU__)
  char dir[B_PATH_NAME_LENGTH];
  if (!prefix) {
    if (find_directory(B_SYSTEM_DIRECTORY, -1, false, dir, sizeof(dir)) ==
        B_OK) {
      prefix = dir;
    } else {
      prefix = "/boot/system";
    }
  }
#else
  if (!prefix) {
    prefix = "/usr/local";
  }
#endif
  if (const char* stagingPrefix =
        this->Makefile->GetDefinition("CMAKE_STAGING_PREFIX")) {
    prefix = stagingPrefix;
  }

  // Compute the set of configurations.
  std::vector<std::string> configurationTypes;
  const std::string& config =
    this->Makefile->GetConfigurations(configurationTypes, false);

  // Choose a default install configuration.
  std::string default_config = config;
  const char* default_order[] = { "RELEASE", "MINSIZEREL", "RELWITHDEBINFO",
                                  "DEBUG", nullptr };
  for (const char** c = default_order; *c && default_config.empty(); ++c) {
    for (std::string const& configurationType : configurationTypes) {
      if (cmSystemTools::UpperCase(configurationType) == *c) {
        default_config = configurationType;
      }
    }
  }
  if (default_config.empty() && !configurationTypes.empty()) {
    default_config = configurationTypes[0];
  }

  // Create the install script file.
  std::string file = this->StateSnapshot.GetDirectory().GetCurrentBinary();
  std::string homedir = this->GetState()->GetBinaryDirectory();
  int toplevel_install = 0;
  if (file == homedir) {
    toplevel_install = 1;
  }
  file += "/cmake_install.cmake";
  cmGeneratedFileStream fout(file);
  fout.SetCopyIfDifferent(true);

  // Write the header.
  fout << "# Install script for directory: "
       << this->StateSnapshot.GetDirectory().GetCurrentSource() << std::endl
       << std::endl;
  fout << "# Set the install prefix" << std::endl
       << "if(NOT DEFINED CMAKE_INSTALL_PREFIX)" << std::endl
       << "  set(CMAKE_INSTALL_PREFIX \"" << prefix << "\")" << std::endl
       << "endif()" << std::endl
       << R"(string(REGEX REPLACE "/$" "" CMAKE_INSTALL_PREFIX )"
       << "\"${CMAKE_INSTALL_PREFIX}\")" << std::endl
       << std::endl;

  // Write support code for generating per-configuration install rules.
  /* clang-format off */
  fout <<
    "# Set the install configuration name.\n"
    "if(NOT DEFINED CMAKE_INSTALL_CONFIG_NAME)\n"
    "  if(BUILD_TYPE)\n"
    "    string(REGEX REPLACE \"^[^A-Za-z0-9_]+\" \"\"\n"
    "           CMAKE_INSTALL_CONFIG_NAME \"${BUILD_TYPE}\")\n"
    "  else()\n"
    "    set(CMAKE_INSTALL_CONFIG_NAME \"" << default_config << "\")\n"
    "  endif()\n"
    "  message(STATUS \"Install configuration: "
    "\\\"${CMAKE_INSTALL_CONFIG_NAME}\\\"\")\n"
    "endif()\n"
    "\n";
  /* clang-format on */

  // Write support code for dealing with component-specific installs.
  /* clang-format off */
  fout <<
    "# Set the component getting installed.\n"
    "if(NOT CMAKE_INSTALL_COMPONENT)\n"
    "  if(COMPONENT)\n"
    "    message(STATUS \"Install component: \\\"${COMPONENT}\\\"\")\n"
    "    set(CMAKE_INSTALL_COMPONENT \"${COMPONENT}\")\n"
    "  else()\n"
    "    set(CMAKE_INSTALL_COMPONENT)\n"
    "  endif()\n"
    "endif()\n"
    "\n";
  /* clang-format on */

  // Copy user-specified install options to the install code.
  if (const char* so_no_exe =
        this->Makefile->GetDefinition("CMAKE_INSTALL_SO_NO_EXE")) {
    /* clang-format off */
    fout <<
      "# Install shared libraries without execute permission?\n"
      "if(NOT DEFINED CMAKE_INSTALL_SO_NO_EXE)\n"
      "  set(CMAKE_INSTALL_SO_NO_EXE \"" << so_no_exe << "\")\n"
      "endif()\n"
      "\n";
    /* clang-format on */
  }

  // Copy cmake cross compile state to install code.
  if (const char* crosscompiling =
        this->Makefile->GetDefinition("CMAKE_CROSSCOMPILING")) {
    /* clang-format off */
    fout <<
      "# Is this installation the result of a crosscompile?\n"
      "if(NOT DEFINED CMAKE_CROSSCOMPILING)\n"
      "  set(CMAKE_CROSSCOMPILING \"" << crosscompiling << "\")\n"
      "endif()\n"
      "\n";
    /* clang-format on */
  }

  // Write default directory permissions.
  if (const char* defaultDirPermissions = this->Makefile->GetDefinition(
        "CMAKE_INSTALL_DEFAULT_DIRECTORY_PERMISSIONS")) {
    /* clang-format off */
    fout <<
      "# Set default install directory permissions.\n"
      "if(NOT DEFINED CMAKE_INSTALL_DEFAULT_DIRECTORY_PERMISSIONS)\n"
      "  set(CMAKE_INSTALL_DEFAULT_DIRECTORY_PERMISSIONS \""
         << defaultDirPermissions << "\")\n"
      "endif()\n"
      "\n";
    /* clang-format on */
  }

  // Ask each install generator to write its code.
  cmPolicies::PolicyStatus status = this->GetPolicyStatus(cmPolicies::CMP0082);
  std::vector<cmInstallGenerator*> const& installers =
    this->Makefile->GetInstallGenerators();
  bool haveSubdirectoryInstall = false;
  bool haveInstallAfterSubdirectory = false;
  if (status == cmPolicies::WARN) {
    for (cmInstallGenerator* installer : installers) {
      installer->CheckCMP0082(haveSubdirectoryInstall,
                              haveInstallAfterSubdirectory);
      installer->Generate(fout, config, configurationTypes);
    }
  } else {
    for (cmInstallGenerator* installer : installers) {
      installer->Generate(fout, config, configurationTypes);
    }
  }

  // Write rules from old-style specification stored in targets.
  this->GenerateTargetInstallRules(fout, config, configurationTypes);

  // Include install scripts from subdirectories.
  switch (status) {
    case cmPolicies::WARN:
      if (haveInstallAfterSubdirectory &&
          this->Makefile->PolicyOptionalWarningEnabled(
            "CMAKE_POLICY_WARNING_CMP0082")) {
        std::ostringstream e;
        e << cmPolicies::GetPolicyWarning(cmPolicies::CMP0082) << "\n";
        this->IssueMessage(MessageType::AUTHOR_WARNING, e.str());
      }
      CM_FALLTHROUGH;
    case cmPolicies::OLD: {
      std::vector<cmStateSnapshot> children =
        this->Makefile->GetStateSnapshot().GetChildren();
      if (!children.empty()) {
        fout << "if(NOT CMAKE_INSTALL_LOCAL_ONLY)\n";
        fout << "  # Include the install script for each subdirectory.\n";
        for (cmStateSnapshot const& c : children) {
          if (!c.GetDirectory().GetPropertyAsBool("EXCLUDE_FROM_ALL")) {
            std::string odir = c.GetDirectory().GetCurrentBinary();
            cmSystemTools::ConvertToUnixSlashes(odir);
            fout << "  include(\"" << odir << "/cmake_install.cmake\")"
                 << std::endl;
          }
        }
        fout << "\n";
        fout << "endif()\n\n";
      }
    } break;

    case cmPolicies::REQUIRED_IF_USED:
    case cmPolicies::REQUIRED_ALWAYS:
    case cmPolicies::NEW:
      // NEW behavior is handled in
      // cmInstallSubdirectoryGenerator::GenerateScript()
      break;
  }

  // Record the install manifest.
  if (toplevel_install) {
    /* clang-format off */
    fout <<
      "if(CMAKE_INSTALL_COMPONENT)\n"
      "  set(CMAKE_INSTALL_MANIFEST \"install_manifest_"
      "${CMAKE_INSTALL_COMPONENT}.txt\")\n"
      "else()\n"
      "  set(CMAKE_INSTALL_MANIFEST \"install_manifest.txt\")\n"
      "endif()\n"
      "\n"
      "string(REPLACE \";\" \"\\n\" CMAKE_INSTALL_MANIFEST_CONTENT\n"
      "       \"${CMAKE_INSTALL_MANIFEST_FILES}\")\n"
      "file(WRITE \"" << homedir << "/${CMAKE_INSTALL_MANIFEST}\"\n"
      "     \"${CMAKE_INSTALL_MANIFEST_CONTENT}\")\n";
    /* clang-format on */
  }
}